

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Stream::write_format<int,char_const*>(Stream *this,char *fmt,int *args,char **args_1)

{
  undefined4 uVar1;
  size_type sVar2;
  reference pvVar3;
  allocator_type local_859;
  undefined1 local_858 [8];
  vector<char,_std::allocator<char>_> glowable_buf;
  char local_838 [4];
  int n;
  char buf [2048];
  int bufsiz;
  char **args_local_1;
  int *args_local;
  char *fmt_local;
  Stream *this_local;
  
  glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       snprintf(local_838,0x7ff,fmt,(ulong)(uint)*args,*args_1);
  if (0 < (int)glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
    if ((int)glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 0x7ff) {
      (*this->_vptr_Stream[3])
                (this,local_838,
                 (long)(int)glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            _20_4_);
    }
    else {
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_858,0x800,&local_859);
      std::allocator<char>::~allocator(&local_859);
      while (uVar1 = glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
            sVar2 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)local_858),
            (int)sVar2 + -1 <= (int)uVar1) {
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_858);
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_858,sVar2 * 2);
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_858,0);
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_858);
        glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
             snprintf(pvVar3,sVar2 - 1,fmt,(ulong)(uint)*args,*args_1);
      }
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_858,0);
      (*this->_vptr_Stream[3])
                (this,pvVar3,
                 (long)(int)glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            _20_4_);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_858);
    }
  }
  return;
}

Assistant:

inline void Stream::write_format(const char* fmt, const Args& ...args)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

#if defined(_MSC_VER) && _MSC_VER < 1900
    auto n = _snprintf_s(buf, bufsiz, bufsiz - 1, fmt, args...);
#else
    auto n = snprintf(buf, bufsiz - 1, fmt, args...);
#endif
    if (n > 0) {
        if (n >= bufsiz - 1) {
            std::vector<char> glowable_buf(bufsiz);

            while (n >= static_cast<int>(glowable_buf.size() - 1)) {
                glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
                n = _snprintf_s(&glowable_buf[0], glowable_buf.size(), glowable_buf.size() - 1, fmt, args...);
#else
                n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
            }
            write(&glowable_buf[0], n);
        } else {
            write(buf, n);
        }
    }
}